

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.cxx
# Opt level: O1

void __thiscall
anon_unknown.dwarf_2798c1::DebGenerator::DebGenerator
          (DebGenerator *this,cmCPackLog *logger,string *outputName,string *workDir,
          string *topLevelDir,string *temporaryDir,cmValue debCompressionType,cmValue numThreads,
          cmValue debianArchiveType,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *controlValues,bool genShLibs,string *shLibsFilename,bool genPostInst,string *postInst,
          bool genPostRm,string *postRm,cmValue controlExtra,bool permissionStrictPolicy,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *packageFiles)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long *plVar4;
  pointer pcVar5;
  cmCPackLog *pcVar6;
  undefined8 uVar7;
  bool bVar8;
  int iVar9;
  ostream *poVar10;
  size_t sVar11;
  ostringstream cmCPackLog_msg;
  long *local_218;
  long local_210;
  long local_208 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d0;
  long *local_1c8;
  long local_1b8 [2];
  undefined1 local_1a8 [376];
  
  this->Logger = logger;
  local_1d0 = &(this->OutputName).field_2;
  (this->OutputName)._M_dataplus._M_p = (pointer)local_1d0;
  pcVar5 = (outputName->_M_dataplus)._M_p;
  paVar1 = &outputName->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar1) {
    uVar7 = *(undefined8 *)((long)&outputName->field_2 + 8);
    local_1d0->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->OutputName).field_2 + 8) = uVar7;
  }
  else {
    (this->OutputName)._M_dataplus._M_p = pcVar5;
    (this->OutputName).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->OutputName)._M_string_length = outputName->_M_string_length;
  (outputName->_M_dataplus)._M_p = (pointer)paVar1;
  outputName->_M_string_length = 0;
  (outputName->field_2)._M_local_buf[0] = '\0';
  local_1d8 = &(this->WorkDir).field_2;
  (this->WorkDir)._M_dataplus._M_p = (pointer)local_1d8;
  pcVar5 = (workDir->_M_dataplus)._M_p;
  paVar1 = &workDir->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar1) {
    uVar7 = *(undefined8 *)((long)&workDir->field_2 + 8);
    local_1d8->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->WorkDir).field_2 + 8) = uVar7;
  }
  else {
    (this->WorkDir)._M_dataplus._M_p = pcVar5;
    (this->WorkDir).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->WorkDir)._M_string_length = workDir->_M_string_length;
  (workDir->_M_dataplus)._M_p = (pointer)paVar1;
  workDir->_M_string_length = 0;
  (workDir->field_2)._M_local_buf[0] = '\0';
  local_1e0 = &(this->CompressionSuffix).field_2;
  (this->CompressionSuffix)._M_dataplus._M_p = (pointer)local_1e0;
  (this->CompressionSuffix)._M_string_length = 0;
  (this->CompressionSuffix).field_2._M_local_buf[0] = '\0';
  local_1e8 = &(this->TopLevelDir).field_2;
  (this->TopLevelDir)._M_dataplus._M_p = (pointer)local_1e8;
  pcVar5 = (topLevelDir->_M_dataplus)._M_p;
  paVar1 = &topLevelDir->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar1) {
    uVar7 = *(undefined8 *)((long)&topLevelDir->field_2 + 8);
    local_1e8->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->TopLevelDir).field_2 + 8) = uVar7;
  }
  else {
    (this->TopLevelDir)._M_dataplus._M_p = pcVar5;
    (this->TopLevelDir).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->TopLevelDir)._M_string_length = topLevelDir->_M_string_length;
  (topLevelDir->_M_dataplus)._M_p = (pointer)paVar1;
  topLevelDir->_M_string_length = 0;
  (topLevelDir->field_2)._M_local_buf[0] = '\0';
  local_1f0 = &(this->TemporaryDir).field_2;
  (this->TemporaryDir)._M_dataplus._M_p = (pointer)local_1f0;
  pcVar5 = (temporaryDir->_M_dataplus)._M_p;
  paVar1 = &temporaryDir->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar1) {
    uVar7 = *(undefined8 *)((long)&temporaryDir->field_2 + 8);
    local_1f0->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->TemporaryDir).field_2 + 8) = uVar7;
  }
  else {
    (this->TemporaryDir)._M_dataplus._M_p = pcVar5;
    (this->TemporaryDir).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  psVar2 = &this->CompressionSuffix;
  (this->TemporaryDir)._M_string_length = temporaryDir->_M_string_length;
  (temporaryDir->_M_dataplus)._M_p = (pointer)paVar1;
  temporaryDir->_M_string_length = 0;
  (temporaryDir->field_2)._M_local_buf[0] = '\0';
  local_1f8 = &(this->DebianArchiveType).field_2;
  (this->DebianArchiveType)._M_dataplus._M_p = (pointer)local_1f8;
  if (debianArchiveType.Value == (string *)0x0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&this->DebianArchiveType,"gnutar","");
  }
  else {
    pcVar5 = ((debianArchiveType.Value)->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&this->DebianArchiveType,pcVar5,
               pcVar5 + (debianArchiveType.Value)->_M_string_length);
  }
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->ControlValues)._M_t._M_impl.super__Rb_tree_header,
             &(controlValues->_M_t)._M_impl.super__Rb_tree_header);
  this->GenShLibs = genShLibs;
  paVar3 = &(this->ShLibsFilename).field_2;
  (this->ShLibsFilename)._M_dataplus._M_p = (pointer)paVar3;
  pcVar5 = (shLibsFilename->_M_dataplus)._M_p;
  paVar1 = &shLibsFilename->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar1) {
    uVar7 = *(undefined8 *)((long)&shLibsFilename->field_2 + 8);
    paVar3->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->ShLibsFilename).field_2 + 8) = uVar7;
  }
  else {
    (this->ShLibsFilename)._M_dataplus._M_p = pcVar5;
    (this->ShLibsFilename).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->ShLibsFilename)._M_string_length = shLibsFilename->_M_string_length;
  (shLibsFilename->_M_dataplus)._M_p = (pointer)paVar1;
  shLibsFilename->_M_string_length = 0;
  (shLibsFilename->field_2)._M_local_buf[0] = '\0';
  this->GenPostInst = genPostInst;
  paVar3 = &(this->PostInst).field_2;
  (this->PostInst)._M_dataplus._M_p = (pointer)paVar3;
  pcVar5 = (postInst->_M_dataplus)._M_p;
  paVar1 = &postInst->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar1) {
    uVar7 = *(undefined8 *)((long)&postInst->field_2 + 8);
    paVar3->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->PostInst).field_2 + 8) = uVar7;
  }
  else {
    (this->PostInst)._M_dataplus._M_p = pcVar5;
    (this->PostInst).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->PostInst)._M_string_length = postInst->_M_string_length;
  (postInst->_M_dataplus)._M_p = (pointer)paVar1;
  postInst->_M_string_length = 0;
  (postInst->field_2)._M_local_buf[0] = '\0';
  this->GenPostRm = genPostRm;
  paVar3 = &(this->PostRm).field_2;
  (this->PostRm)._M_dataplus._M_p = (pointer)paVar3;
  pcVar5 = (postRm->_M_dataplus)._M_p;
  paVar1 = &postRm->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar1) {
    uVar7 = *(undefined8 *)((long)&postRm->field_2 + 8);
    paVar3->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->PostRm).field_2 + 8) = uVar7;
  }
  else {
    (this->PostRm)._M_dataplus._M_p = pcVar5;
    (this->PostRm).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->PostRm)._M_string_length = postRm->_M_string_length;
  (postRm->_M_dataplus)._M_p = (pointer)paVar1;
  postRm->_M_string_length = 0;
  (postRm->field_2)._M_local_buf[0] = '\0';
  (this->ControlExtra).Value = controlExtra.Value;
  this->PermissionStrictPolicy = permissionStrictPolicy;
  (this->PackageFiles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (packageFiles->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->PackageFiles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (packageFiles->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  (this->PackageFiles).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (packageFiles->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (packageFiles->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (packageFiles->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (packageFiles->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_218 = local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"gzip","");
  if (debCompressionType.Value != (string *)0x0) {
    std::__cxx11::string::_M_assign((string *)&local_218);
  }
  iVar9 = std::__cxx11::string::compare((char *)&local_218);
  if (iVar9 == 0) {
    std::__cxx11::string::_M_replace
              ((ulong)psVar2,0,(char *)(this->CompressionSuffix)._M_string_length,0x822e50);
    this->TarCompressionType = CompressLZMA;
  }
  else {
    iVar9 = std::__cxx11::string::compare((char *)&local_218);
    if (iVar9 == 0) {
      std::__cxx11::string::_M_replace
                ((ulong)psVar2,0,(char *)(this->CompressionSuffix)._M_string_length,0x8224c4);
      this->TarCompressionType = CompressXZ;
    }
    else {
      iVar9 = std::__cxx11::string::compare((char *)&local_218);
      if (iVar9 == 0) {
        std::__cxx11::string::_M_replace
                  ((ulong)psVar2,0,(char *)(this->CompressionSuffix)._M_string_length,0x8224bb);
        this->TarCompressionType = CompressBZip2;
      }
      else {
        iVar9 = std::__cxx11::string::compare((char *)&local_218);
        if (iVar9 == 0) {
          std::__cxx11::string::_M_replace
                    ((ulong)psVar2,0,(char *)(this->CompressionSuffix)._M_string_length,0x82d54f);
          this->TarCompressionType = CompressGZip;
        }
        else {
          iVar9 = std::__cxx11::string::compare((char *)&local_218);
          if (iVar9 == 0) {
            std::__cxx11::string::_M_replace
                      ((ulong)psVar2,0,(char *)(this->CompressionSuffix)._M_string_length,0x8224d3);
            this->TarCompressionType = CompressZstd;
          }
          else {
            iVar9 = std::__cxx11::string::compare((char *)&local_218);
            if (iVar9 == 0) {
              (this->CompressionSuffix)._M_string_length = 0;
              *(this->CompressionSuffix)._M_dataplus._M_p = '\0';
              this->TarCompressionType = CompressNone;
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"Error unrecognized compression type: ",0x25);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8,(char *)local_218,local_210);
              std::endl<char,std::char_traits<char>>(poVar10);
              pcVar6 = this->Logger;
              std::__cxx11::stringbuf::str();
              plVar4 = local_1c8;
              sVar11 = strlen((char *)local_1c8);
              cmCPackLog::Log(pcVar6,0x10,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                              ,0x7d,(char *)plVar4,sVar11);
              if (local_1c8 != local_1b8) {
                operator_delete(local_1c8,local_1b8[0] + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
            }
          }
        }
      }
    }
  }
  plVar4 = &this->NumThreads;
  if (numThreads.Value == (string *)0x0) {
    *plVar4 = 1;
  }
  else {
    bVar8 = cmStrToLong(numThreads.Value,plVar4);
    if (!bVar8) {
      *plVar4 = 1;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Unrecognized number of threads: ",0x20);
      poVar10 = operator<<((ostream *)local_1a8,numThreads);
      std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      pcVar6 = this->Logger;
      std::__cxx11::stringbuf::str();
      plVar4 = local_1c8;
      sVar11 = strlen((char *)local_1c8);
      cmCPackLog::Log(pcVar6,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                      ,0x85,(char *)plVar4,sVar11);
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8,local_1b8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    }
  }
  if (local_218 != local_208) {
    operator_delete(local_218,local_208[0] + 1);
  }
  return;
}

Assistant:

DebGenerator::DebGenerator(
  cmCPackLog* logger, std::string outputName, std::string workDir,
  std::string topLevelDir, std::string temporaryDir,
  cmValue debCompressionType, cmValue numThreads, cmValue debianArchiveType,
  std::map<std::string, std::string> controlValues, bool genShLibs,
  std::string shLibsFilename, bool genPostInst, std::string postInst,
  bool genPostRm, std::string postRm, cmValue controlExtra,
  bool permissionStrictPolicy, std::vector<std::string> packageFiles)
  : Logger(logger)
  , OutputName(std::move(outputName))
  , WorkDir(std::move(workDir))
  , TopLevelDir(std::move(topLevelDir))
  , TemporaryDir(std::move(temporaryDir))
  , DebianArchiveType(debianArchiveType ? *debianArchiveType : "gnutar")
  , ControlValues(std::move(controlValues))
  , GenShLibs(genShLibs)
  , ShLibsFilename(std::move(shLibsFilename))
  , GenPostInst(genPostInst)
  , PostInst(std::move(postInst))
  , GenPostRm(genPostRm)
  , PostRm(std::move(postRm))
  , ControlExtra(controlExtra)
  , PermissionStrictPolicy(permissionStrictPolicy)
  , PackageFiles(std::move(packageFiles))
{
  std::string debianCompressionType = "gzip";
  if (debCompressionType) {
    debianCompressionType = *debCompressionType;
  }

  if (debianCompressionType == "lzma") {
    this->CompressionSuffix = ".lzma";
    this->TarCompressionType = cmArchiveWrite::CompressLZMA;
  } else if (debianCompressionType == "xz") {
    this->CompressionSuffix = ".xz";
    this->TarCompressionType = cmArchiveWrite::CompressXZ;
  } else if (debianCompressionType == "bzip2") {
    this->CompressionSuffix = ".bz2";
    this->TarCompressionType = cmArchiveWrite::CompressBZip2;
  } else if (debianCompressionType == "gzip") {
    this->CompressionSuffix = ".gz";
    this->TarCompressionType = cmArchiveWrite::CompressGZip;
  } else if (debianCompressionType == "zstd") {
    this->CompressionSuffix = ".zst";
    this->TarCompressionType = cmArchiveWrite::CompressZstd;
  } else if (debianCompressionType == "none") {
    this->CompressionSuffix.clear();
    this->TarCompressionType = cmArchiveWrite::CompressNone;
  } else {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Error unrecognized compression type: "
                    << debianCompressionType << std::endl);
  }

  if (numThreads) {
    if (!cmStrToLong(*numThreads, &this->NumThreads)) {
      this->NumThreads = 1;
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Unrecognized number of threads: " << numThreads
                                                       << std::endl);
    }
  } else {
    this->NumThreads = 1;
  }
}